

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O2

void __thiscall
hand::createHand(hand *this,stack<card,_std::deque<card,_std::allocator<card>_>_> *deck)

{
  int iVar1;
  _Elt_pointer pcVar2;
  bool bVar3;
  card temp;
  
  pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pcVar2 == (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data
             ._M_finish._M_node[-1] + 10;
  }
  card::card(&temp,pcVar2 + -1);
  iVar1 = 10;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data
             ._M_finish._M_cur;
    if (pcVar2 == (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    card::operator=(&temp,pcVar2 + -1);
    if (temp.cardType == 0) {
      this->regularCards = this->regularCards + 1;
    }
    else {
      this->specialCards = this->specialCards + 1;
    }
    std::vector<card,_std::allocator<card>_>::push_back(&this->hand_,&temp);
    std::deque<card,_std::allocator<card>_>::pop_back(&deck->c);
  }
  std::__cxx11::string::~string((string *)&temp.name);
  return;
}

Assistant:

void hand::createHand(stack<card> &deck) {
    card temp = deck.top();
    for(int i = 0; i < START_HAND_QUANTITY; i++) {
        temp = deck.top();
        if (isRegularCard(temp)) setRegularCards(1+getRegularCards());
        else setSpecialCards(1+getSpecialCards());
        hand_.push_back(temp);
        deck.pop();
    }
}